

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O2

GLFWwindow *
glfwCreateWindow(int width,int height,char *title,GLFWmonitor *monitor,GLFWwindow *share)

{
  int iVar1;
  GLFWbool GVar2;
  _GLFWwindow *handle;
  char *pcVar3;
  long lVar4;
  _GLFWfbconfig *p_Var5;
  _GLFWfbconfig *p_Var6;
  _GLFWctxconfig ctxconfig;
  _GLFWfbconfig fbconfig;
  _GLFWwndconfig wndconfig;
  
  if (title == (char *)0x0) {
    __assert_fail("title != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sonoro1234[P]LuaJIT-GLFW/GLFW/src/window.c"
                  ,0xbe,
                  "GLFWwindow *glfwCreateWindow(int, int, const char *, GLFWmonitor *, GLFWwindow *)"
                 );
  }
  if (width < 0) {
    __assert_fail("width >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sonoro1234[P]LuaJIT-GLFW/GLFW/src/window.c"
                  ,0xbf,
                  "GLFWwindow *glfwCreateWindow(int, int, const char *, GLFWmonitor *, GLFWwindow *)"
                 );
  }
  if (height < 0) {
    __assert_fail("height >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sonoro1234[P]LuaJIT-GLFW/GLFW/src/window.c"
                  ,0xc0,
                  "GLFWwindow *glfwCreateWindow(int, int, const char *, GLFWmonitor *, GLFWwindow *)"
                 );
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if (width == 0 || height == 0) {
    _glfwInputError(0x10004,"Invalid window size %ix%i",(ulong)(uint)width,height);
  }
  else {
    p_Var5 = &_glfw.hints.framebuffer;
    p_Var6 = &fbconfig;
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      iVar1 = p_Var5->greenBits;
      p_Var6->redBits = p_Var5->redBits;
      p_Var6->greenBits = iVar1;
      p_Var5 = (_GLFWfbconfig *)&p_Var5->blueBits;
      p_Var6 = (_GLFWfbconfig *)&p_Var6->blueBits;
    }
    ctxconfig._48_8_ = _glfw.hints.context._48_8_;
    ctxconfig._32_8_ = _glfw.hints.context._32_8_;
    ctxconfig.share = _glfw.hints.context.share;
    ctxconfig._16_8_ = _glfw.hints.context._16_8_;
    ctxconfig._24_8_ = _glfw.hints.context._24_8_;
    ctxconfig._0_8_ = _glfw.hints.context._0_8_;
    ctxconfig._8_8_ = _glfw.hints.context._8_8_;
    memcpy(&wndconfig,&_glfw.hints.window,0x450);
    ctxconfig.share = (_GLFWwindow *)share;
    wndconfig.width = width;
    wndconfig.height = height;
    wndconfig.title = title;
    GVar2 = _glfwIsValidContextConfig(&ctxconfig);
    if (GVar2 != 0) {
      handle = (_GLFWwindow *)_glfw_calloc(1,0xd58);
      handle->next = _glfw.windowListHead;
      _glfw.windowListHead = handle;
      (handle->videoMode).width = width;
      (handle->videoMode).height = height;
      (handle->videoMode).redBits = fbconfig.redBits;
      (handle->videoMode).greenBits = fbconfig.greenBits;
      (handle->videoMode).blueBits = fbconfig.blueBits;
      (handle->videoMode).refreshRate = _glfw.hints.refreshRate;
      handle->monitor = (_GLFWmonitor *)monitor;
      handle->resizable = wndconfig.resizable;
      handle->decorated = wndconfig.decorated;
      handle->autoIconify = wndconfig.autoIconify;
      handle->floating = wndconfig.floating;
      handle->focusOnShow = wndconfig.focusOnShow;
      handle->mousePassthrough = wndconfig.mousePassthrough;
      handle->cursorMode = 0x34001;
      handle->doublebuffer = fbconfig.doublebuffer;
      handle->minwidth = -1;
      handle->minheight = -1;
      handle->maxwidth = -1;
      handle->maxheight = -1;
      handle->numer = -1;
      handle->denom = -1;
      pcVar3 = _glfw_strdup(title);
      handle->title = pcVar3;
      GVar2 = (*_glfw.platform.createWindow)(handle,&wndconfig,&ctxconfig,&fbconfig);
      if (GVar2 != 0) {
        return (GLFWwindow *)handle;
      }
      glfwDestroyWindow((GLFWwindow *)handle);
    }
  }
  return (GLFWwindow *)0x0;
}

Assistant:

GLFWAPI GLFWwindow* glfwCreateWindow(int width, int height,
                                     const char* title,
                                     GLFWmonitor* monitor,
                                     GLFWwindow* share)
{
    _GLFWfbconfig fbconfig;
    _GLFWctxconfig ctxconfig;
    _GLFWwndconfig wndconfig;
    _GLFWwindow* window;

    assert(title != NULL);
    assert(width >= 0);
    assert(height >= 0);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (width <= 0 || height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Invalid window size %ix%i",
                        width, height);

        return NULL;
    }

    fbconfig  = _glfw.hints.framebuffer;
    ctxconfig = _glfw.hints.context;
    wndconfig = _glfw.hints.window;

    wndconfig.width   = width;
    wndconfig.height  = height;
    wndconfig.title   = title;
    ctxconfig.share   = (_GLFWwindow*) share;

    if (!_glfwIsValidContextConfig(&ctxconfig))
        return NULL;

    window = _glfw_calloc(1, sizeof(_GLFWwindow));
    window->next = _glfw.windowListHead;
    _glfw.windowListHead = window;

    window->videoMode.width       = width;
    window->videoMode.height      = height;
    window->videoMode.redBits     = fbconfig.redBits;
    window->videoMode.greenBits   = fbconfig.greenBits;
    window->videoMode.blueBits    = fbconfig.blueBits;
    window->videoMode.refreshRate = _glfw.hints.refreshRate;

    window->monitor          = (_GLFWmonitor*) monitor;
    window->resizable        = wndconfig.resizable;
    window->decorated        = wndconfig.decorated;
    window->autoIconify      = wndconfig.autoIconify;
    window->floating         = wndconfig.floating;
    window->focusOnShow      = wndconfig.focusOnShow;
    window->mousePassthrough = wndconfig.mousePassthrough;
    window->cursorMode       = GLFW_CURSOR_NORMAL;

    window->doublebuffer = fbconfig.doublebuffer;

    window->minwidth    = GLFW_DONT_CARE;
    window->minheight   = GLFW_DONT_CARE;
    window->maxwidth    = GLFW_DONT_CARE;
    window->maxheight   = GLFW_DONT_CARE;
    window->numer       = GLFW_DONT_CARE;
    window->denom       = GLFW_DONT_CARE;
    window->title       = _glfw_strdup(title);

    if (!_glfw.platform.createWindow(window, &wndconfig, &ctxconfig, &fbconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        return NULL;
    }

    return (GLFWwindow*) window;
}